

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O0

ON_SubDVertex * __thiscall ON_SubDHeap::VertexFromId(ON_SubDHeap *this,uint vertex_id)

{
  uint uVar1;
  ON_SubDVertex *vertex;
  uint vertex_id_local;
  ON_SubDHeap *this_local;
  
  if ((vertex_id == 0) || (vertex_id == 0xffffffff)) {
    ON_SubDIncrementErrorCount();
    this_local = (ON_SubDHeap *)0x0;
  }
  else {
    this_local = (ON_SubDHeap *)
                 ON_FixedSizePool::ElementFromId(&this->m_fspv,m_offset_vertex_id,vertex_id);
    if ((this_local == (ON_SubDHeap *)0x0) ||
       (vertex_id != *(uint *)&(this_local->m_fspv).m_first_block)) {
      ON_SubDIncrementErrorCount();
      this_local = (ON_SubDHeap *)0x0;
    }
    else {
      uVar1 = ON_SubDComponentBase::ArchiveId((ON_SubDComponentBase *)this_local);
      if (uVar1 == 0xffffffff) {
        ON_SubDIncrementErrorCount();
        this_local = (ON_SubDHeap *)0x0;
      }
    }
  }
  return (ON_SubDVertex *)this_local;
}

Assistant:

const class ON_SubDVertex* ON_SubDHeap::VertexFromId(
  unsigned int vertex_id
  ) const
{
  if ( 0 == vertex_id || ON_UNSET_UINT_INDEX == vertex_id)
    return ON_SUBD_RETURN_ERROR(nullptr);
  const class ON_SubDVertex* vertex = (const class ON_SubDVertex*)m_fspv.ElementFromId(ON_SubDHeap::m_offset_vertex_id,vertex_id);
  if ( nullptr == vertex || vertex_id != vertex->m_id)
    return ON_SUBD_RETURN_ERROR(nullptr);
  if ( ON_UNSET_UINT_INDEX == vertex->ArchiveId() )
    return ON_SUBD_RETURN_ERROR(nullptr);
  return vertex;
}